

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O2

void gama_modification_init(gama_modification *me,png_modifier *pm,double gammad)

{
  double dVar1;
  
  modification_init(&me->this);
  (me->this).chunk = 0x67414d41;
  (me->this).modify_fn = gama_modify;
  (me->this).add = 0x504c5445;
  dVar1 = floor(gammad * 100000.0 + 0.5);
  me->gamma = (int)dVar1;
  (me->this).next = pm->modifications;
  pm->modifications = &me->this;
  return;
}

Assistant:

static void
gama_modification_init(gama_modification *me, png_modifier *pm, double gammad)
{
   double g;

   modification_init(&me->this);
   me->this.chunk = CHUNK_gAMA;
   me->this.modify_fn = gama_modify;
   me->this.add = CHUNK_PLTE;
   g = fix(gammad);
   me->gamma = (png_fixed_point)g;
   me->this.next = pm->modifications;
   pm->modifications = &me->this;
}